

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

bool whisper_kv_cache_init
               (whisper_kv_cache *cache,ggml_backend_t backend,ggml_type wtype,int64_t n_text_state,
               int64_t n_text_layer,int n_ctx)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  long in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  long in_R8;
  int in_R9D;
  ggml_context *ctx;
  ggml_init_params params;
  int64_t n_elements;
  int64_t n_mem;
  undefined4 *__new_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff80;
  bool local_1;
  
  lVar1 = in_RCX * in_R8 * in_R9D;
  __new_size = in_RDI + 0x10;
  ggml_tensor_overhead();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffff80,(size_type)__new_size);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1eae53);
  *in_RDI = 0;
  in_RDI[1] = in_R9D;
  std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::clear
            ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)0x1eae8b);
  std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::resize
            ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)in_stack_ffffffffffffff80,
             (size_type)__new_size);
  lVar2 = ggml_init();
  if (lVar2 == 0) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: failed to allocate memory for the kv cache context\n",
               "whisper_kv_cache_init");
    local_1 = false;
  }
  else {
    uVar3 = ggml_new_tensor_1d(lVar2,in_EDX,lVar1);
    *(undefined8 *)(in_RDI + 10) = uVar3;
    uVar3 = ggml_new_tensor_1d(lVar2,in_EDX,lVar1);
    *(undefined8 *)(in_RDI + 0xc) = uVar3;
    uVar3 = ggml_backend_alloc_ctx_tensors(lVar2,in_RSI);
    *(undefined8 *)(in_RDI + 0xe) = uVar3;
    if (*(long *)(in_RDI + 0xe) == 0) {
      whisper_log_internal
                (GGML_LOG_LEVEL_ERROR,"%s: failed to allocate memory for the kv cache\n",
                 "whisper_kv_cache_init");
      local_1 = false;
    }
    else {
      ggml_backend_buffer_clear(*(undefined8 *)(in_RDI + 0xe),0);
      ggml_free(lVar2);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool whisper_kv_cache_init(
             struct whisper_kv_cache & cache,
                      ggml_backend_t   backend,
                           ggml_type   wtype,
                             int64_t   n_text_state,
                             int64_t   n_text_layer,
                                 int   n_ctx) {
    const int64_t n_mem      = n_text_layer*n_ctx;
    const int64_t n_elements = n_text_state*n_mem;

    cache.ctx_buf.resize(2*ggml_tensor_overhead());

    struct ggml_init_params params = {
        /*.mem_size   =*/ cache.ctx_buf.size(),
        /*.mem_buffer =*/ cache.ctx_buf.data(),
        /*.no_alloc   =*/ true,
    };

    cache.head = 0;
    cache.size = n_ctx;

    cache.cells.clear();
    cache.cells.resize(n_ctx);

    struct ggml_context * ctx = ggml_init(params);

    if (!ctx) {
        WHISPER_LOG_ERROR("%s: failed to allocate memory for the kv cache context\n", __func__);
        return false;
    }

    cache.k = ggml_new_tensor_1d(ctx, wtype, n_elements);
    cache.v = ggml_new_tensor_1d(ctx, wtype, n_elements);

    cache.buffer = ggml_backend_alloc_ctx_tensors(ctx, backend);
    if (!cache.buffer) {
        WHISPER_LOG_ERROR("%s: failed to allocate memory for the kv cache\n", __func__);
        return false;
    }

    ggml_backend_buffer_clear(cache.buffer, 0);

    ggml_free(ctx);

    return true;
}